

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_enum.cc
# Opt level: O2

char * i2s_ASN1_ENUMERATED_TABLE(X509V3_EXT_METHOD *meth,ASN1_ENUMERATED *aint)

{
  int *piVar1;
  long lVar2;
  char *pcVar3;
  undefined8 *puVar4;
  
  lVar2 = ASN1_ENUMERATED_get(aint);
  puVar4 = (undefined8 *)((long)meth->usr_data + 8);
  do {
    pcVar3 = (char *)*puVar4;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = i2s_ASN1_ENUMERATED(meth,aint);
      return pcVar3;
    }
    piVar1 = (int *)(puVar4 + -1);
    puVar4 = puVar4 + 3;
  } while (lVar2 != *piVar1);
  pcVar3 = OPENSSL_strdup(pcVar3);
  return pcVar3;
}

Assistant:

static char *i2s_ASN1_ENUMERATED_TABLE(const X509V3_EXT_METHOD *method,
                                       void *ext) {
  const ASN1_ENUMERATED *e = reinterpret_cast<const ASN1_ENUMERATED *>(ext);
  long strval = ASN1_ENUMERATED_get(e);
  for (const ENUMERATED_NAMES *enam =
           reinterpret_cast<const ENUMERATED_NAMES *>(method->usr_data);
       enam->lname; enam++) {
    if (strval == enam->bitnum) {
      return OPENSSL_strdup(enam->lname);
    }
  }
  return i2s_ASN1_ENUMERATED(method, e);
}